

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidateNotation
              (xmlSchemaValidCtxtPtr vctxt,xmlSchemaPtr schema,xmlNodePtr node,xmlChar *value,
              xmlSchemaValPtr *val,int valNeeded)

{
  xmlNsPtr pxVar1;
  xmlSchemaNotationPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *ns_00;
  xmlSchemaValPtr pxVar4;
  xmlNsPtr ns;
  xmlChar *nsName;
  xmlChar *prefix;
  xmlChar *localName;
  int ret;
  int valNeeded_local;
  xmlSchemaValPtr *val_local;
  xmlChar *value_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  localName._4_4_ = valNeeded;
  _ret = val;
  val_local = (xmlSchemaValPtr *)value;
  value_local = (xmlChar *)node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)vctxt;
  if ((vctxt == (xmlSchemaValidCtxtPtr)0x0) || (vctxt->schema != (xmlSchemaPtr)0x0)) {
    localName._0_4_ = xmlValidateQName(value,1);
    vctxt_local._4_4_ = (int)localName;
    if ((int)localName == 0) {
      prefix = (xmlChar *)0x0;
      nsName = (xmlChar *)0x0;
      prefix = xmlSplitQName2((xmlChar *)val_local,&nsName);
      if (nsName == (xmlChar *)0x0) {
        pxVar2 = xmlSchemaGetNotation((xmlSchemaPtr)node_local,(xmlChar *)val_local,(xmlChar *)0x0);
        if (pxVar2 == (xmlSchemaNotationPtr)0x0) {
          return 1;
        }
        if ((localName._4_4_ != 0) && (_ret != (xmlSchemaValPtr *)0x0)) {
          pxVar3 = xmlStrdup((xmlChar *)val_local);
          pxVar4 = xmlSchemaNewNOTATIONValue(pxVar3,(xmlChar *)0x0);
          *_ret = pxVar4;
          if (*_ret == (xmlSchemaValPtr)0x0) {
            localName._0_4_ = -1;
          }
        }
      }
      else {
        ns = (xmlNsPtr)0x0;
        if (schema_local == (xmlSchemaPtr)0x0) {
          if (value_local == (xmlChar *)0x0) {
            (*xmlFree)(nsName);
            (*xmlFree)(prefix);
            return 1;
          }
          pxVar1 = xmlSearchNs(*(xmlDocPtr *)(value_local + 0x40),(xmlNodePtr)value_local,nsName);
          if (pxVar1 != (xmlNsPtr)0x0) {
            ns = (xmlNsPtr)pxVar1->href;
          }
        }
        else {
          ns = (xmlNsPtr)xmlSchemaLookupNamespace((xmlSchemaValidCtxtPtr)schema_local,nsName);
        }
        if (ns == (xmlNsPtr)0x0) {
          (*xmlFree)(nsName);
          (*xmlFree)(prefix);
          return 1;
        }
        pxVar2 = xmlSchemaGetNotation((xmlSchemaPtr)node_local,prefix,(xmlChar *)ns);
        if (pxVar2 == (xmlSchemaNotationPtr)0x0) {
          localName._0_4_ = 1;
        }
        else if ((localName._4_4_ != 0) && (_ret != (xmlSchemaValPtr *)0x0)) {
          pxVar3 = xmlStrdup(prefix);
          ns_00 = xmlStrdup((xmlChar *)ns);
          pxVar4 = xmlSchemaNewNOTATIONValue(pxVar3,ns_00);
          *_ret = pxVar4;
          if (*_ret == (xmlSchemaValPtr)0x0) {
            localName._0_4_ = -1;
          }
        }
        (*xmlFree)(nsName);
        (*xmlFree)(prefix);
      }
      vctxt_local._4_4_ = (int)localName;
    }
  }
  else {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidateNotation",
               "a schema is needed on the validation context");
    vctxt_local._4_4_ = -1;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidateNotation(xmlSchemaValidCtxtPtr vctxt,
			  xmlSchemaPtr schema,
			  xmlNodePtr node,
			  const xmlChar *value,
			  xmlSchemaValPtr *val,
			  int valNeeded)
{
    int ret;

    if (vctxt && (vctxt->schema == NULL)) {
	VERROR_INT("xmlSchemaValidateNotation",
	    "a schema is needed on the validation context");
	return (-1);
    }
    ret = xmlValidateQName(value, 1);
    if (ret != 0)
	return (ret);
    {
	xmlChar *localName = NULL;
	xmlChar *prefix = NULL;

	localName = xmlSplitQName2(value, &prefix);
	if (prefix != NULL) {
	    const xmlChar *nsName = NULL;

	    if (vctxt != NULL)
		nsName = xmlSchemaLookupNamespace(vctxt, BAD_CAST prefix);
	    else if (node != NULL) {
		xmlNsPtr ns = xmlSearchNs(node->doc, node, prefix);
		if (ns != NULL)
		    nsName = ns->href;
	    } else {
		xmlFree(prefix);
		xmlFree(localName);
		return (1);
	    }
	    if (nsName == NULL) {
		xmlFree(prefix);
		xmlFree(localName);
		return (1);
	    }
	    if (xmlSchemaGetNotation(schema, localName, nsName) != NULL) {
		if ((valNeeded) && (val != NULL)) {
		    (*val) = xmlSchemaNewNOTATIONValue(xmlStrdup(localName),
						       xmlStrdup(nsName));
		    if (*val == NULL)
			ret = -1;
		}
	    } else
		ret = 1;
	    xmlFree(prefix);
	    xmlFree(localName);
	} else {
	    if (xmlSchemaGetNotation(schema, value, NULL) != NULL) {
		if (valNeeded && (val != NULL)) {
		    (*val) = xmlSchemaNewNOTATIONValue(
			BAD_CAST xmlStrdup(value), NULL);
		    if (*val == NULL)
			ret = -1;
		}
	    } else
		return (1);
	}
    }
    return (ret);
}